

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall
pbrt::ParsedScene::CreateMaterials
          (ParsedScene *this,NamedTextures *textures,Allocator alloc,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>_>
          *namedMaterialsOut,
          vector<pbrt::MaterialHandle,_std::allocator<pbrt::MaterialHandle>_> *materialsOut)

{
  ParameterDictionary *this_00;
  pointer ppVar1;
  pointer pSVar2;
  _Rep_type *p_Var3;
  pointer pbVar4;
  pointer pbVar5;
  iterator iVar6;
  mapped_type *ppIVar7;
  mapped_type *pmVar8;
  pointer pSVar9;
  pointer ppVar10;
  mapped_type pIVar11;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>_>
  *this_01;
  allocator<char> local_1a9;
  ParsedScene *local_1a8;
  allocator<char> local_199;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>_>
  *local_198;
  Allocator alloc_local;
  string type;
  string fn_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  normalMapFilenameVector;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Image_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Image_*>_>_>
  normalMapCache;
  TextureParameterDictionary texDict;
  MaterialHandle m;
  _Any_data local_a8;
  code *pcStack_98;
  code *pcStack_90;
  mutex mutex;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  normalMapFilenames;
  
  normalMapFilenames._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &normalMapFilenames._M_t._M_impl.super__Rb_tree_header._M_header;
  normalMapFilenames._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  normalMapFilenames._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  normalMapFilenames._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppVar1 = (this->namedMaterials).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar10 = (this->namedMaterials).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_1a8 = this;
  local_198 = &namedMaterialsOut->_M_t;
  alloc_local.memoryResource = alloc.memoryResource;
  normalMapFilenames._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       normalMapFilenames._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (; ppVar10 != ppVar1; ppVar10 = ppVar10 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&mutex,"normalmap",(allocator<char> *)&fn_2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&type,"",(allocator<char> *)&texDict);
    ParameterDictionary::GetOneString
              ((string *)&normalMapCache,&(ppVar10->second).parameters,(string *)&mutex,&type);
    std::__cxx11::string::~string((string *)&type);
    std::__cxx11::string::~string((string *)&mutex);
    if (CONCAT44(normalMapCache._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                 normalMapCache._M_t._M_impl.super__Rb_tree_header._M_header._M_color) != 0) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&normalMapFilenames,(string *)&normalMapCache);
    }
    std::__cxx11::string::~string((string *)&normalMapCache);
  }
  pSVar2 = (local_1a8->materials).
           super__Vector_base<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pSVar9 = (local_1a8->materials).
                super__Vector_base<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>._M_impl.
                super__Vector_impl_data._M_start; pSVar9 != pSVar2; pSVar9 = pSVar9 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&mutex,"normalmap",(allocator<char> *)&fn_2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&type,"",(allocator<char> *)&texDict);
    ParameterDictionary::GetOneString
              ((string *)&normalMapCache,&pSVar9->parameters,(string *)&mutex,&type);
    std::__cxx11::string::~string((string *)&type);
    std::__cxx11::string::~string((string *)&mutex);
    if (CONCAT44(normalMapCache._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                 normalMapCache._M_t._M_impl.super__Rb_tree_header._M_header._M_color) != 0) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&normalMapFilenames,(string *)&normalMapCache);
    }
    std::__cxx11::string::~string((string *)&normalMapCache);
  }
  normalMapFilenameVector.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  normalMapFilenameVector.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  normalMapFilenameVector.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__copy_move<false,false,std::bidirectional_iterator_tag>::
  __copy_m<std::_Rb_tree_const_iterator<std::__cxx11::string>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )normalMapFilenames._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )&normalMapFilenames._M_t._M_impl.super__Rb_tree_header,&normalMapFilenameVector);
  if (LOGGING_LogLevel < 1) {
    normalMapCache._M_t._M_impl._0_8_ =
         (long)normalMapFilenameVector.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)normalMapFilenameVector.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 5;
    Log<unsigned_long>(Verbose,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parsedscene.cpp"
                       ,0x2ae,"Reading %d normal maps in parallel",(unsigned_long *)&normalMapCache)
    ;
  }
  pbVar5 = normalMapFilenameVector.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar4 = normalMapFilenameVector.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  normalMapCache._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &normalMapCache._M_t._M_impl.super__Rb_tree_header._M_header;
  mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  normalMapCache._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  normalMapCache._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  normalMapCache._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  mutex.super___mutex_base._M_mutex.__align = 0;
  mutex.super___mutex_base._M_mutex._8_8_ = 0;
  mutex.super___mutex_base._M_mutex._16_8_ = 0;
  mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  pcStack_98 = (code *)0x0;
  pcStack_90 = (code *)0x0;
  normalMapCache._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       normalMapCache._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_a8._M_unused._M_object = operator_new(0x28);
  *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    **)local_a8._M_unused._0_8_ = &normalMapFilenameVector;
  *(ParsedScene **)((long)local_a8._M_unused._0_8_ + 8) = local_1a8;
  *(Allocator **)((long)local_a8._M_unused._0_8_ + 0x10) = &alloc_local;
  *(string **)((long)local_a8._M_unused._0_8_ + 0x18) = (string *)&mutex;
  *(string **)((long)local_a8._M_unused._0_8_ + 0x20) = (string *)&normalMapCache;
  pcStack_90 = std::
               _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parsedscene.cpp:689:52)>
               ::_M_invoke;
  pcStack_98 = std::
               _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parsedscene.cpp:689:52)>
               ::_M_manager;
  ParallelFor(0,(long)pbVar5 - (long)pbVar4 >> 5,(function<void_(long)> *)&local_a8);
  std::_Function_base::~_Function_base((_Function_base *)&local_a8);
  this_01 = local_198;
  if (LOGGING_LogLevel < 1) {
    Log(Verbose,
        "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parsedscene.cpp"
        ,0x2c1,"Done reading normal maps");
  }
  ppVar1 = (local_1a8->namedMaterials).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  p_Var3 = (_Rep_type *)&this_01->_M_impl;
  for (ppVar10 = (local_1a8->namedMaterials).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar10 != ppVar1; ppVar10 = ppVar10 + 1
      ) {
    iVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>_>
            ::find(this_01,&ppVar10->first);
    if ((_Rb_tree_header *)iVar6._M_node == &(p_Var3->_M_impl).super__Rb_tree_header) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fn_2,"type",(allocator<char> *)&m);
      std::__cxx11::string::string<std::allocator<char>>((string *)&texDict,"",&local_1a9);
      this_00 = &(ppVar10->second).parameters;
      ParameterDictionary::GetOneString(&type,this_00,&fn_2,(string *)&texDict);
      std::__cxx11::string::~string((string *)&texDict);
      std::__cxx11::string::~string((string *)&fn_2);
      if (type._M_string_length == 0) {
        (local_1a8->super_SceneRepresentation).errorExit = true;
        Error<std::__cxx11::string_const&>
                  (&(ppVar10->second).loc,
                   "%s: \"string type\" not provided in named material\'s parameters.",
                   &ppVar10->first);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&texDict,"normalmap",&local_1a9);
        std::__cxx11::string::string<std::allocator<char>>((string *)&m,"",&local_199);
        ParameterDictionary::GetOneString(&fn_2,this_00,(string *)&texDict,(string *)&m);
        std::__cxx11::string::~string((string *)&m);
        std::__cxx11::string::~string((string *)&texDict);
        if (fn_2._M_string_length == 0) {
          pIVar11 = (Image *)0x0;
        }
        else {
          ppIVar7 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Image_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Image_*>_>_>
                    ::operator[](&normalMapCache,&fn_2);
          pIVar11 = *ppIVar7;
        }
        TextureParameterDictionary::TextureParameterDictionary(&texDict,this_00,textures);
        this_01 = local_198;
        MaterialHandle::Create
                  (&m,&type,&texDict,pIVar11,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>_>
                    *)local_198,&(ppVar10->second).loc,alloc_local);
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>_>
                               *)this_01,&ppVar10->first);
        (pmVar8->
        super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
        ).bits = (uintptr_t)
                 m.
                 super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
                 .bits;
        std::__cxx11::string::~string((string *)&fn_2);
      }
      std::__cxx11::string::~string((string *)&type);
    }
    else {
      (local_1a8->super_SceneRepresentation).errorExit = true;
      Error<std::__cxx11::string_const&>
                (&(ppVar10->second).loc,"%s: trying to redefine named material.",&ppVar10->first);
    }
  }
  std::vector<pbrt::MaterialHandle,_std::allocator<pbrt::MaterialHandle>_>::reserve
            (materialsOut,
             ((long)(local_1a8->materials).
                    super__Vector_base<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(local_1a8->materials).
                   super__Vector_base<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>._M_impl
                   .super__Vector_impl_data._M_start) / 0xa0);
  pSVar2 = (local_1a8->materials).
           super__Vector_base<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pSVar9 = (local_1a8->materials).
                super__Vector_base<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>._M_impl.
                super__Vector_impl_data._M_start; pSVar9 != pSVar2; pSVar9 = pSVar9 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fn_2,"normalmap",(allocator<char> *)&m);
    std::__cxx11::string::string<std::allocator<char>>((string *)&texDict,"",&local_1a9);
    ParameterDictionary::GetOneString(&type,&pSVar9->parameters,&fn_2,(string *)&texDict);
    std::__cxx11::string::~string((string *)&texDict);
    std::__cxx11::string::~string((string *)&fn_2);
    if (type._M_string_length == 0) {
      pIVar11 = (Image *)0x0;
    }
    else {
      ppIVar7 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Image_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Image_*>_>_>
                ::operator[](&normalMapCache,&type);
      pIVar11 = *ppIVar7;
    }
    TextureParameterDictionary::TextureParameterDictionary
              ((TextureParameterDictionary *)&fn_2,&pSVar9->parameters,textures);
    MaterialHandle::Create
              ((MaterialHandle *)&texDict,&pSVar9->name,(TextureParameterDictionary *)&fn_2,pIVar11,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>_>
                *)local_198,&pSVar9->loc,alloc_local);
    std::vector<pbrt::MaterialHandle,_std::allocator<pbrt::MaterialHandle>_>::push_back
              (materialsOut,(value_type *)&texDict);
    std::__cxx11::string::~string((string *)&type);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Image_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Image_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Image_*>_>_>
  ::~_Rb_tree(&normalMapCache._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&normalMapFilenameVector);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&normalMapFilenames._M_t);
  return;
}

Assistant:

void ParsedScene::CreateMaterials(
    /*const*/ NamedTextures &textures, Allocator alloc,
    std::map<std::string, MaterialHandle> *namedMaterialsOut,
    std::vector<MaterialHandle> *materialsOut) const {
    // First, load all of the normal maps in parallel.
    std::set<std::string> normalMapFilenames;
    for (const auto &nm : namedMaterials) {
        std::string fn = nm.second.parameters.GetOneString("normalmap", "");
        if (!fn.empty())
            normalMapFilenames.insert(fn);
    }
    for (const auto &mtl : materials) {
        std::string fn = mtl.parameters.GetOneString("normalmap", "");
        if (!fn.empty())
            normalMapFilenames.insert(fn);
    }

    std::vector<std::string> normalMapFilenameVector;
    std::copy(normalMapFilenames.begin(), normalMapFilenames.end(),
              std::back_inserter(normalMapFilenameVector));

    LOG_VERBOSE("Reading %d normal maps in parallel", normalMapFilenameVector.size());
    std::map<std::string, Image *> normalMapCache;
    std::mutex mutex;
    ParallelFor(0, normalMapFilenameVector.size(), [&](int64_t index) {
        std::string filename = normalMapFilenameVector[index];
        ImageAndMetadata immeta =
            Image::Read(filename, Allocator(), ColorEncodingHandle::Linear);
        Image &image = immeta.image;
        ImageChannelDesc rgbDesc = image.GetChannelDesc({"R", "G", "B"});
        if (!rgbDesc)
            ErrorExitDeferred("%s: normal map image must contain R, G, and B channels",
                              filename);
        Image *normalMap = alloc.new_object<Image>(alloc);
        *normalMap = image.SelectChannels(rgbDesc);

        mutex.lock();
        normalMapCache[filename] = normalMap;
        mutex.unlock();
    });
    LOG_VERBOSE("Done reading normal maps");

    // Named materials
    for (const auto &nm : namedMaterials) {
        const std::string &name = nm.first;
        const SceneEntity &mtl = nm.second;
        if (namedMaterialsOut->find(name) != namedMaterialsOut->end()) {
            ErrorExitDeferred(&mtl.loc, "%s: trying to redefine named material.", name);
            continue;
        }

        std::string type = mtl.parameters.GetOneString("type", "");
        if (type.empty()) {
            ErrorExitDeferred(&mtl.loc,
                              "%s: \"string type\" not provided in named material's "
                              "parameters.",
                              name);
            continue;
        }

        std::string fn = nm.second.parameters.GetOneString("normalmap", "");
        Image *normalMap = !fn.empty() ? normalMapCache[fn] : nullptr;

        TextureParameterDictionary texDict(&mtl.parameters, &textures);
        MaterialHandle m = MaterialHandle::Create(type, texDict, normalMap,
                                                  *namedMaterialsOut, &mtl.loc, alloc);
        (*namedMaterialsOut)[name] = m;
    }

    // Regular materials
    materialsOut->reserve(materials.size());
    for (const auto &mtl : materials) {
        std::string fn = mtl.parameters.GetOneString("normalmap", "");
        Image *normalMap = !fn.empty() ? normalMapCache[fn] : nullptr;

        TextureParameterDictionary texDict(&mtl.parameters, &textures);
        MaterialHandle m = MaterialHandle::Create(mtl.name, texDict, normalMap,
                                                  *namedMaterialsOut, &mtl.loc, alloc);
        materialsOut->push_back(m);
    }
}